

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

void lsvm::system::free_process(process *p)

{
  current_process = p->next;
  if (current_process != (process_t *)0x0) {
    current_process->prev = p->prev;
  }
  *p->prev = current_process;
  processes_count = processes_count + -1;
  memory::retain(p);
  return;
}

Assistant:

void free_process(process* p){
    current_process = p->next;
    if(current_process != null)
        current_process->prev = p->prev;
    *(p->prev) = current_process;
    --processes_count;
    lsvm::memory::retain(p);
}